

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Instruction * __thiscall
spv::Builder::addEntryPoint(Builder *this,ExecutionModel model,Function *function,char *name)

{
  _Head_base<0UL,_spv::Instruction_*,_false> this_00;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  
  this_00._M_head_impl = (Instruction *)operator_new(0x60);
  (this_00._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
  (this_00._M_head_impl)->resultId = 0;
  (this_00._M_head_impl)->typeId = 0;
  (this_00._M_head_impl)->opCode = OpEntryPoint;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  ((this_00._M_head_impl)->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((this_00._M_head_impl)->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((this_00._M_head_impl)->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this_00._M_head_impl)->block = (Block *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&(this_00._M_head_impl)->operands,3);
  if (((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage ==
      ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&(this_00._M_head_impl)->idOperand,3);
  }
  Instruction::addImmediateOperand(this_00._M_head_impl,model);
  Instruction::addIdOperand(this_00._M_head_impl,(function->functionInstruction).resultId);
  Instruction::addStringOperand(this_00._M_head_impl,name);
  local_30._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)this_00._M_head_impl;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->entryPoints,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
      local_30._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
  }
  return (_Head_base<0UL,_spv::Instruction_*,_false>)this_00._M_head_impl;
}

Assistant:

Instruction* Builder::addEntryPoint(ExecutionModel model, Function* function, const char* name)
{
    Instruction* entryPoint = new Instruction(OpEntryPoint);
    entryPoint->reserveOperands(3);
    entryPoint->addImmediateOperand(model);
    entryPoint->addIdOperand(function->getId());
    entryPoint->addStringOperand(name);

    entryPoints.push_back(std::unique_ptr<Instruction>(entryPoint));

    return entryPoint;
}